

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O2

int ncnn::convolution1d(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int stride_w,int dilation_w,int activation_type,Mat *activation_params,
                       Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  float *pfVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  float *pfVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  uVar2 = bottom_blob->h;
  uVar3 = top_blob->w;
  pvVar4 = bias_data->data;
  if (pvVar4 == (void *)0x0) {
    bVar22 = true;
  }
  else {
    bVar22 = (long)bias_data->c * bias_data->cstep == 0;
  }
  pvVar5 = top_blob->data;
  sVar6 = top_blob->elemsize;
  uVar10 = 0;
  uVar14 = 0;
  if (0 < kernel_w) {
    uVar14 = (ulong)(uint)kernel_w;
  }
  uVar19 = 0;
  if (0 < (int)uVar2) {
    uVar19 = (ulong)uVar2;
  }
  uVar15 = 0;
  if (0 < (int)uVar3) {
    uVar15 = (ulong)uVar3;
  }
  uVar9 = top_blob->h;
  if (top_blob->h < 1) {
    uVar9 = uVar10;
  }
  for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
    pfVar7 = (float *)activation_params->data;
    pvVar8 = weight_data->data;
    lVar21 = 0;
    for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
      fVar25 = 0.0;
      if (!bVar22) {
        fVar25 = *(float *)((long)pvVar4 + uVar12 * 4);
      }
      pfVar11 = (float *)((long)bottom_blob->data + lVar21);
      pvVar13 = (void *)((long)(int)uVar10 * 4 + (long)pvVar8);
      for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
        pfVar18 = pfVar11;
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          fVar25 = fVar25 + *(float *)((long)pvVar13 + uVar17 * 4) * *pfVar18;
          pfVar18 = pfVar18 + dilation_w;
        }
        pvVar13 = (void *)((long)pvVar13 + (long)kernel_w * 4);
        pfVar11 = (float *)((long)pfVar11 + (long)bottom_blob->w * bottom_blob->elemsize);
      }
      fVar23 = fVar25;
      switch(activation_type) {
      case 1:
        if (fVar25 <= 0.0) {
          fVar23 = 0.0;
        }
        break;
      case 2:
        fVar23 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar7 | -(uint)(0.0 < fVar25) & 0x3f800000
                        ) * fVar25;
        break;
      case 3:
        if (fVar25 <= *pfVar7) {
          fVar25 = *pfVar7;
        }
        fVar23 = pfVar7[1];
        if (fVar25 <= pfVar7[1]) {
          fVar23 = fVar25;
        }
        break;
      case 4:
        if (88.37626 <= fVar25) {
          fVar25 = 88.37626;
        }
        fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                             ~-(uint)(fVar25 < -88.37626) & (uint)-fVar25));
        fVar23 = 1.0 / (fVar25 + 1.0);
        break;
      case 5:
        fVar23 = expf(fVar25);
        fVar23 = logf(fVar23 + 1.0);
        fVar23 = tanhf(fVar23);
        fVar23 = fVar23 * fVar25;
        break;
      case 6:
        fVar1 = *pfVar7;
        fVar24 = -pfVar7[1] / fVar1;
        fVar23 = 0.0;
        if ((fVar24 <= fVar25) && (fVar23 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
          fVar23 = (fVar1 * fVar25 + pfVar7[1]) * fVar25;
        }
      }
      *(float *)((long)pvVar5 + uVar20 * 4 + (long)(int)uVar3 * sVar6 * uVar12) = fVar23;
      lVar21 = lVar21 + (long)stride_w * 4;
    }
    uVar10 = uVar10 + uVar2 * kernel_w;
  }
  return uVar10;
}

Assistant:

static int convolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        float* outptr = top_blob.row(p);

        for (int j = 0; j < outw; j++)
        {
            float sum = 0.f;

            if (bias_term)
                sum = bias_data[p];

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float* sptr = bottom_blob.row(q) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float wt = kptr[k];
                    sum += val * wt;

                    sptr += dilation_w;
                }

                kptr += kernel_w;
            }

            sum = activation_ss(sum, activation_type, activation_params);

            outptr[j] = sum;
        }
    }

    return 0;
}